

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O1

void __thiscall http::Page::PageOK(Page *this,char *mimeType)

{
  size_t sVar1;
  ostream *poVar2;
  
  this->HTTPHeaderSent = true;
  poVar2 = &this->m_ostream;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"HTTP/1.0 200 OK\r\nContent-type: ",0x1f);
  if (mimeType == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(mimeType);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,mimeType,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n\r\n",4);
  return;
}

Assistant:

void http::Page::PageOK(const char* mimeType)
{
    HTTPHeaderSent = true;
    std::ostream& out = get_output_stream();
    out << "HTTP/1.0 200 OK\r\nContent-type: ";
    out << mimeType;
    out << "\r\n\r\n";
}